

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_block_statemach(connectdata *conn)

{
  CURLcode CVar1;
  
  if ((conn->proto).imapc.state == IMAP_STOP) {
    return CURLE_OK;
  }
  do {
    CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true);
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CVar1;
    }
  } while (CVar1 == CURLE_OK);
  return CVar1;
}

Assistant:

static CURLcode smtp_block_statemach(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  while(smtpc->state != SMTP_STOP && !result)
    result = Curl_pp_statemach(&smtpc->pp, TRUE);

  return result;
}